

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffmvec(fitsfile *fptr,int colnum,LONGLONG newveclen,int *status)

{
  uint uVar1;
  FITSfile *pFVar2;
  tcolumn *ptVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char tcode [2];
  int tstatus;
  char tfm [71];
  char keyname [75];
  undefined2 local_10e;
  int local_10c;
  long local_108;
  long local_100;
  LONGLONG local_f8;
  int local_ec;
  long local_e8;
  long local_e0;
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_00118156;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  if (pFVar2->hdutype != 2) {
    ffpmsg("Can only change vector length of a column in BINTABLE extension (ffmvec)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((colnum < 1) || (pFVar2->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar3 = pFVar2->tableptr;
  uVar1 = colnum - 1;
  iVar4 = ptVar3[uVar1].tdatatype;
  if (iVar4 < 0) {
    ffpmsg("Can\'t modify vector length of variable length column (ffmvec)");
    *status = 0x105;
    return 0x105;
  }
  lVar7 = ptVar3[uVar1].trepeat;
  if (newveclen - lVar7 == 0) goto LAB_00118156;
  lVar8 = 1;
  if (iVar4 != 0x10) {
    lVar8 = ptVar3[uVar1].twidth;
  }
  if (iVar4 == 1) {
    lVar9 = newveclen + 0xe;
    if (-1 < newveclen + 7) {
      lVar9 = newveclen + 7;
    }
    lVar6 = lVar7 + 0xe;
    if (-1 < lVar7 + 7) {
      lVar6 = lVar7 + 7;
    }
    lVar9 = (lVar9 >> 3) - (lVar6 >> 3);
  }
  else {
    lVar9 = (newveclen - lVar7) * lVar8;
  }
  lVar6 = pFVar2->numrows;
  local_f8 = pFVar2->rowlength;
  if (lVar9 < 1) {
    if (lVar9 < 0) {
      lVar7 = pFVar2->heapsize + pFVar2->heapstart;
      lVar5 = lVar9 * lVar6;
      lVar7 = (((lVar7 + 0xb3f) / 0xb40) * 0xb40 - lVar7) - lVar5;
      local_108 = SUB168(SEXT816(lVar7) * SEXT816(0x2d82d82d82d82d83),8);
      local_10c = iVar4;
      local_100 = lVar9;
      ffcdel(fptr,local_f8,lVar6,-lVar9,lVar8 * newveclen + ptVar3[uVar1].tbcol,status);
      pFVar2 = fptr->Fptr;
      if ((0 < pFVar2->heapsize) &&
         (iVar4 = ffshft(fptr,pFVar2->heapstart + pFVar2->datastart,pFVar2->heapsize,lVar5,status),
         0 < iVar4)) goto LAB_00118156;
      if (0xb3f < lVar7) {
        ffdblk(fptr,(local_108 >> 9) - (local_108 >> 0x3f),status);
      }
      lVar5 = lVar5 + fptr->Fptr->heapstart;
      fptr->Fptr->heapstart = lVar5;
      local_ec = 0;
      ffmkyj(fptr,"THEAP",lVar5,"&",&local_ec);
      lVar9 = local_100;
      iVar4 = local_10c;
    }
  }
  else {
    lVar5 = (pFVar2->heapsize + pFVar2->heapstart + 0xb3f) % 0xb40;
    lVar10 = lVar9 * lVar6;
    local_10c = iVar4;
    local_108 = lVar8;
    local_100 = lVar9;
    local_e8 = lVar7;
    local_e0 = lVar6;
    if ((0xb3f - lVar5 < lVar10) &&
       (iVar4 = ffiblk(fptr,(lVar5 + lVar10) / 0xb40,1,status), 0 < iVar4)) goto LAB_00118156;
    pFVar2 = fptr->Fptr;
    if ((0 < pFVar2->heapsize) &&
       (iVar4 = ffshft(fptr,pFVar2->heapstart + pFVar2->datastart,pFVar2->heapsize,lVar10,status),
       0 < iVar4)) goto LAB_00118156;
    lVar10 = lVar10 + fptr->Fptr->heapstart;
    fptr->Fptr->heapstart = lVar10;
    local_ec = 0;
    ffmkyj(fptr,"THEAP",lVar10,"&",&local_ec);
    lVar9 = local_100;
    ffcins(fptr,local_f8,local_e0,local_100,local_108 * local_e8 + fptr->Fptr->tableptr[uVar1].tbcol
           ,status);
    iVar4 = local_10c;
  }
  if (iVar4 == 1) {
    local_10e = 0x58;
  }
  else if (iVar4 == 0xe) {
    local_10e = 0x4c;
  }
  else if (iVar4 == 0xb) {
    local_10e = 0x42;
  }
  else if (iVar4 == 0x10) {
    local_10e = 0x41;
  }
  else if (iVar4 < 0x51) {
    if (iVar4 == 0x15) {
      local_10e = 0x49;
    }
    else if (iVar4 == 0x29) {
      local_10e = 0x4a;
    }
    else if (iVar4 == 0x2a) {
      local_10e = 0x45;
    }
  }
  else if (iVar4 < 0x53) {
    if (iVar4 == 0x51) {
      local_10e = 0x4b;
    }
    else if (iVar4 == 0x52) {
      local_10e = 0x44;
    }
  }
  else if (iVar4 == 0x53) {
    local_10e = 0x43;
  }
  else if (iVar4 == 0xa3) {
    local_10e = 0x4d;
  }
  snprintf(local_d8,0x47,"%.0f%s",(double)newveclen,&local_10e);
  ffkeyn("TFORM",colnum,local_88,status);
  ffmkys(fptr,local_88,local_d8,"&",status);
  ffmkyj(fptr,"NAXIS1",lVar9 + local_f8,"&",status);
  ffrdef(fptr,status);
LAB_00118156:
  return *status;
}

Assistant:

int ffmvec(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - position of col to be modified           */
           LONGLONG newveclen,  /* I - new vector length of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
  Modify the vector length of a column in a binary table, larger or smaller.
  E.g., change a column from TFORMn = '1E' to '20E'.
*/
{
    int datacode, tfields, tstatus;
    LONGLONG datasize, size, firstbyte, nbytes, nadd, ndelete;
    LONGLONG naxis1, naxis2, firstcol, freespace;
    LONGLONG width, delbyte, repeat;
    long nblock;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], tcode[2];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
  "Can only change vector length of a column in BINTABLE extension (ffmvec)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (colnum < 1 || colnum > tfields)
        return(*status = BAD_COL_NUM);

    /* look up the current vector length and element width */

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);

    datacode = colptr->tdatatype; /* datatype of the column */
    repeat =  colptr->trepeat;  /* field repeat count  */
    width =  colptr->twidth;   /*  width of a single element in chars */

    if (datacode < 0)
    {
        ffpmsg(
        "Can't modify vector length of variable length column (ffmvec)");
        return(*status = BAD_TFORM);
    }

    if (repeat == newveclen)
        return(*status);  /* column already has the desired vector length */

    if (datacode == TSTRING)
        width = 1;      /* width was equal to width of unit string */

    naxis1 =  (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    delbyte = (newveclen - repeat) * width;    /* no. of bytes to insert */
    if (datacode == TBIT)  /* BIT column is a special case */
       delbyte = ((newveclen + 7) / 8) - ((repeat + 7) / 8);

    if (delbyte > 0)  /* insert space for more elements */
    {
      /* current size of data */
      datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;

      nadd = (LONGLONG)delbyte * naxis2;   /* no. of bytes to add to table */

      if ( (freespace - nadd) < 0)   /* not enough existing space? */
      {
        nblock = (long) ((nadd - freespace + 2879) / 2880);    /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)      /* insert the blocks */
          return(*status);
      }

      /* shift heap down (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
      }

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += nadd;

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

      /* Must reset colptr before using it again.  (fptr->Fptr)->tableptr
         may have been reallocated down in ffbinit via the call to ffiblk above.*/
      colptr = (fptr->Fptr)->tableptr;
      colptr += (colnum - 1);

      firstcol = colptr->tbcol + (repeat * width);  /* insert position */

      /* insert delbyte bytes in every row, at byte position firstcol */
      ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);
    }
    else if (delbyte < 0)
    {
      /* current size of table */
      size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ((size + 2879) / 2880) * 2880 - size - ((LONGLONG)delbyte * naxis2);
      nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */
      firstcol = colptr->tbcol + (newveclen * width);  /* delete position */

      /* delete elements from the vector */
      ffcdel(fptr, naxis1, naxis2, -delbyte, firstcol, status);
 
      /* abs heap pos */
      firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
      ndelete = (LONGLONG)delbyte * naxis2; /* size of shift (negative) */

      /* shift heap up (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */
        if (ffshft(fptr, firstbyte, nbytes, ndelete, status) > 0)
          return(*status);
      }

      /* delete the empty  blocks at the end of the HDU */
      if (nblock > 0)
        ffdblk(fptr, nblock, status);

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += ndelete;  /* ndelete is negative */

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);
    }

    /* construct the new TFORM keyword for the column */
    if (datacode == TBIT)
      strcpy(tcode,"X");
    else if (datacode == TBYTE)
      strcpy(tcode,"B");
    else if (datacode == TLOGICAL)
      strcpy(tcode,"L");
    else if (datacode == TSTRING)
      strcpy(tcode,"A");
    else if (datacode == TSHORT)
      strcpy(tcode,"I");
    else if (datacode == TLONG)
      strcpy(tcode,"J");
    else if (datacode == TLONGLONG)
      strcpy(tcode,"K");
    else if (datacode == TFLOAT)
      strcpy(tcode,"E");
    else if (datacode == TDOUBLE)
      strcpy(tcode,"D");
    else if (datacode == TCOMPLEX)
      strcpy(tcode,"C");
    else if (datacode == TDBLCOMPLEX)
      strcpy(tcode,"M");

    /* write as a double value because the LONGLONG conversion */
    /* character in snprintf is platform dependent ( %lld, %ld, %I64d ) */

    snprintf(tfm,FLEN_VALUE,"%.0f%s",(double) newveclen, tcode); 

    ffkeyn("TFORM", colnum, keyname, status);  /* Keyword name */
    ffmkys(fptr, keyname, tfm, "&", status);   /* modify TFORM keyword */

    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status); /* modify NAXIS1 */

    ffrdef(fptr, status); /* reinitialize the new table structure */
    return(*status);
}